

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_string(basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
           string_type *buffer,error_code *ec)

{
  stream_source<unsigned_char> *this_00;
  size_t *psVar1;
  pointer __nbytes;
  ssize_t sVar2;
  type_conflict2 tVar3;
  size_t in_RCX;
  bson_errc __e;
  size_t length;
  uint8_t c;
  uint8_t buf [4];
  undefined1 local_2d;
  int local_2c;
  
  this_00 = &this->source_;
  sVar2 = stream_source<unsigned_char>::read(this_00,(int)&local_2c,(void *)0x4,in_RCX);
  psVar1 = &(this->state_stack_).
            super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
  *psVar1 = *psVar1 + sVar2;
  if (sVar2 == 4) {
    if ((long)local_2c < 1) {
      __e = string_length_is_non_positive;
      goto LAB_00207d75;
    }
    length = (long)local_2c - 1;
    tVar3 = source_reader<jsoncons::stream_source<unsigned_char>>::read<std::__cxx11::string>
                      (this_00,buffer,length);
    __nbytes = (this->state_stack_).
               super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    psVar1 = &__nbytes[-1].pos;
    *psVar1 = *psVar1 + tVar3;
    if (tVar3 == length) {
      sVar2 = stream_source<unsigned_char>::read
                        (this_00,(int)&local_2d,(void *)0x1,(size_t)__nbytes);
      psVar1 = &(this->state_stack_).
                super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
      *psVar1 = *psVar1 + sVar2;
      if (sVar2 == 1) {
        return;
      }
    }
  }
  __e = unexpected_eof;
LAB_00207d75:
  std::error_code::operator=(ec,__e);
  this->more_ = false;
  return;
}

Assistant:

void read_string(string_type& buffer, std::error_code& ec)
    {
        uint8_t buf[sizeof(int32_t)]; 
        std::size_t n = source_.read(buf, sizeof(int32_t));
        state_stack_.back().pos += n;
        if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }
        auto len = binary::little_to_native<int32_t>(buf, sizeof(buf));
        if (JSONCONS_UNLIKELY(len < 1))
        {
            ec = bson_errc::string_length_is_non_positive;
            more_ = false;
            return;
        }

        std::size_t size = static_cast<std::size_t>(len) - static_cast<std::size_t>(1);
        n = source_reader<Source>::read(source_, buffer, size);
        state_stack_.back().pos += n;

        if (JSONCONS_UNLIKELY(n != size))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }
        uint8_t c;
        n = source_.read(&c, 1);
        state_stack_.back().pos += n;
        if (JSONCONS_UNLIKELY(n != 1))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }
    }